

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zz_gcd.c
# Opt level: O2

bool_t zzIsCoprime(word *a,size_t n,word *b,size_t m,void *stack)

{
  bool_t bVar1;
  size_t n_00;
  word *a_00;
  size_t sVar2;
  
  sVar2 = m;
  if (n < m) {
    sVar2 = n;
  }
  bVar1 = wwIsZero(a,n);
  n_00 = m;
  a_00 = b;
  if ((bVar1 == 0) && (bVar1 = wwIsZero(b,m), n_00 = n, a_00 = a, bVar1 == 0)) {
    zzGCD((word *)stack,a,n,b,m,(void *)((long)stack + sVar2 * 8));
    n_00 = sVar2;
    a_00 = (word *)stack;
  }
  bVar1 = wwIsW(a_00,n_00,1);
  return bVar1;
}

Assistant:

bool_t zzIsCoprime(const word a[], size_t n, const word b[], size_t m, void* stack)
{
	word* d = (word*)stack;
	stack = d + MIN2(n, m);
	// a == 0 => (a, b) = b
	if (wwIsZero(a, n))
		return wwIsW(b, m, 1);
	// b == 0 => (a, b) = a
	if (wwIsZero(b, m))
		return wwIsW(a, n, 1);
	// d <- (a, b), d == 1?
	zzGCD(d, a, n, b, m, stack);
	return wwIsW(d, MIN2(n, m), 1);
}